

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryTransferChild
          (Impl *this,EntryImpl *entry,Type type,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>
          *lastModified,Maybe<unsigned_long> *size,Directory *fromDirectory,PathPtr fromPath,
          TransferMode mode)

{
  PathPtr fromPath_00;
  char cVar1;
  File *pFVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Disposer *pDVar6;
  unsigned_long uVar7;
  Entry *pEVar8;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar9;
  StringPtr name;
  Own<kj::File> copy;
  undefined8 local_148;
  Own<const_kj::Directory> local_118;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> copy_1;
  Array<kj::ReadableDirectory::Entry> local_f0;
  Fault f_2;
  undefined1 auStack_d0 [72];
  InMemoryDirectory *local_88;
  map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
  *local_80;
  String *local_78;
  size_t sStack_70;
  Maybe<unsigned_long> local_68;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_58;
  Path filename;
  
  if (type == SYMLINK) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
              (&copy,fromDirectory,fromPath.parts.ptr);
    cVar1 = (char)copy.disposer;
    f_2.exception._0_1_ = (char)copy.disposer;
    if ((char)copy.disposer == '\x01') {
      auStack_d0._0_8_ = copy.ptr;
      auStack_d0._8_8_ = local_148;
      copy.ptr = (File *)0x0;
    }
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&copy);
    if (cVar1 == '\0') {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x621,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&copy);
    }
    else {
      copy.disposer = (Disposer *)(*(code *)**(undefined8 **)this->clock)();
      if ((lastModified->ptr).isSet == true) {
        copy.disposer = *(Disposer **)&(lastModified->ptr).field_1;
      }
      copy.ptr = (File *)auStack_d0._0_8_;
      auStack_d0._8_8_ = (ArrayDisposer *)0x0;
      EntryImpl::init(entry,(EVP_PKEY_CTX *)&copy);
      Array<char>::~Array((Array<char> *)&copy.ptr);
      bVar3 = true;
      if ((mode != MOVE) ||
         (iVar4 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                            (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_),
         (char)iVar4 != '\0')) goto LAB_00233339;
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x61b,FAILED,"fromDirectory.tryRemove(fromPath)",
                 "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",&fromPath)
      ;
      _::Debug::Fault::~Fault((Fault *)&copy);
    }
    bVar3 = false;
LAB_00233339:
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f_2);
    return bVar3;
  }
  if (type != DIRECTORY) {
    if (type != FILE) {
      return false;
    }
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
              ((Own<const_kj::File> *)&copy,fromDirectory,fromPath.parts.ptr);
    pFVar2 = copy.ptr;
    f_2.exception = (Exception *)copy.disposer;
    copy.ptr = (File *)0x0;
    Own<const_kj::File>::dispose((Own<const_kj::File> *)&copy);
    if (pFVar2 == (File *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x5f2,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&copy);
LAB_002333c8:
      bVar3 = false;
    }
    else {
      if (mode == MOVE) {
        iVar4 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                          (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
        if ((char)iVar4 == '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                    ((Fault *)&copy,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x5ea,FAILED,"fromDirectory.tryRemove(fromPath)",
                     "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                     &fromPath);
          _::Debug::Fault::~Fault((Fault *)&copy);
          goto LAB_002333c8;
        }
      }
      else if (mode == COPY) {
        newInMemoryFile((kj *)&copy,this->clock);
        local_f0.size_ = (size_t)copy.ptr;
        if ((size->ptr).isSet == true) {
          uVar7 = (size->ptr).field_1.value;
        }
        else {
          uVar7 = 0xffffffffffffffff;
        }
        (*((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])
                  (copy.ptr,0,pFVar2,0,uVar7);
        local_f0.ptr = (Entry *)copy.disposer;
        copy.ptr = (File *)0x0;
        EntryImpl::set(entry,(Own<const_kj::File> *)&local_f0);
        Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_f0);
        Own<kj::File>::dispose(&copy);
        bVar3 = true;
        goto LAB_002334d9;
      }
      bVar3 = true;
      EntryImpl::set(entry,(Own<const_kj::File> *)&f_2);
    }
LAB_002334d9:
    Own<const_kj::File>::dispose((Own<const_kj::File> *)&f_2);
    return bVar3;
  }
  (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
            ((Own<const_kj::Directory> *)&f_2,fromDirectory,fromPath.parts.ptr);
  local_118.disposer = (Disposer *)f_2.exception;
  local_118.ptr = (Directory *)auStack_d0._0_8_;
  Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&f_2);
  if (local_118.ptr == (Directory *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
              (&f_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x612,FAILED,(char *)0x0,
               "\"source node deleted concurrently during transfer\", fromPath",
               (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
    _::Debug::Fault::~Fault(&f_2);
LAB_00233389:
    bVar3 = false;
  }
  else {
    if (mode == MOVE) {
      iVar4 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                        (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)iVar4 == '\0') {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                  (&f_2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x60a,FAILED,"fromDirectory.tryRemove(fromPath)",
                   "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                   &fromPath);
        _::Debug::Fault::~Fault(&f_2);
        goto LAB_00233389;
      }
    }
    else if (mode == COPY) {
      OVar9 = atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                        ((kj *)&copy_1,this->clock);
      (*(((ReadableFile *)&(local_118.ptr)->super_ReadableDirectory)->super_FsNode)._vptr_FsNode[7])
                (&local_f0,local_118.ptr,OVar9.ptr);
      local_88 = copy_1.ptr;
      local_80 = (map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                  *)&((copy_1.ptr)->impl).value.entries;
      pEVar8 = local_f0.ptr;
      for (lVar5 = local_f0.size_ << 5; lVar5 != 0; lVar5 = lVar5 + -0x20) {
        copy.disposer = (Disposer *)(pEVar8->name).content.ptr;
        copy.ptr = (File *)(pEVar8->name).content.size_;
        (pEVar8->name).content.ptr = (char *)0x0;
        (pEVar8->name).content.size_ = 0;
        pDVar6 = copy.disposer;
        if (copy.ptr == (File *)0x0) {
          pDVar6 = (Disposer *)0x240547;
        }
        name.content.size_ =
             (long)&((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode +
             (ulong)(copy.ptr == (File *)0x0);
        name.content.ptr = (char *)pDVar6;
        Path::Path((Path *)&filename.parts,name);
        local_58.ptr.isSet = false;
        local_68.ptr.isSet = false;
        local_78 = filename.parts.ptr;
        sStack_70 = filename.parts.size_;
        fromPath_00.parts.size_ = filename.parts.size_;
        fromPath_00.parts.ptr = filename.parts.ptr;
        bVar3 = tryTransferChild(&((copy_1.ptr)->impl).value,(EntryImpl *)&copy,pEVar8->type,
                                 &local_58,&local_68,local_118.ptr,fromPath_00,COPY);
        if (bVar3) {
          f_2.exception = (Exception *)0x240547;
          if (copy.ptr != (File *)0x0) {
            f_2.exception = (Exception *)copy.disposer;
          }
          EntryImpl::EntryImpl((EntryImpl *)(auStack_d0 + 8),(EntryImpl *)&copy);
          std::
          map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
          ::insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                    (local_80,(pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                               *)&f_2);
          EntryImpl::~EntryImpl((EntryImpl *)(auStack_d0 + 8));
        }
        else if (_::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[62],kj::Path&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x601,ERROR,
                     "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename",
                     (char (*) [62])"couldn\'t copy node of type not supported by InMemoryDirectory"
                     ,(Path *)&filename.parts);
        }
        Array<kj::String>::~Array(&filename.parts);
        EntryImpl::~EntryImpl((EntryImpl *)&copy);
        pEVar8 = pEVar8 + 1;
      }
      Array<kj::ReadableDirectory::Entry>::~Array(&local_f0);
      f_2.exception = (Exception *)copy_1.disposer;
      copy_1.ptr = (InMemoryDirectory *)0x0;
      EntryImpl::set(entry,(Own<const_kj::Directory> *)&f_2);
      Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&f_2);
      Own<kj::(anonymous_namespace)::InMemoryDirectory>::~Own(&copy_1);
      bVar3 = true;
      goto LAB_00233485;
    }
    bVar3 = true;
    EntryImpl::set(entry,&local_118);
  }
LAB_00233485:
  Own<const_kj::Directory>::dispose(&local_118);
  return bVar3;
}

Assistant:

bool tryTransferChild(EntryImpl& entry, const FsNode::Type type, kj::Maybe<Date> lastModified,
                          kj::Maybe<uint64_t> size, const Directory& fromDirectory,
                          PathPtr fromPath, TransferMode mode) {
      switch (type) {
        case FsNode::Type::FILE:
          KJ_IF_MAYBE(file, fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY)) {
            if (mode == TransferMode::COPY) {
              auto copy = newInMemoryFile(clock);
              copy->copy(0, **file, 0, size.orDefault(kj::maxValue));
              entry.set(kj::mv(copy));
            } else {
              if (mode == TransferMode::MOVE) {
                KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath) {
                  return false;
                }
              }
              entry.set(kj::mv(*file));
            }
            return true;
          } else {
            KJ_FAIL_ASSERT("source node deleted concurrently during transfer", fromPath) {
              return false;
            }
          }